

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_compensation.cpp
# Opt level: O2

void mc::subtract_block(TRIPLEYCbCr **base,TRIPLEYCbCr **target,TRIPLEYCbCr **out,block_info block,
                       vect v)

{
  uint8_t uVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  
  sVar3 = 0;
  while( true ) {
    lVar2 = block.super_pos.x * 3 + 2;
    sVar4 = block.width;
    if (sVar3 == block.height) break;
    while (bVar5 = sVar4 != 0, sVar4 = sVar4 - 1, bVar5) {
      uVar1 = clip(((uint)(&target[block.super_pos.y + sVar3]->Cr)[lVar2] -
                   (uint)(&base[block.super_pos.y + ((long)v >> 0x20) + sVar3][v.x].Cr)[lVar2]) +
                   0x80,'\0',0xff);
      (&out[block.super_pos.y + sVar3]->Cr)[lVar2] = uVar1;
      lVar2 = lVar2 + 3;
    }
    sVar3 = sVar3 + 1;
  }
  return;
}

Assistant:

void mc::subtract_block(TRIPLEYCbCr **base, TRIPLEYCbCr **target, TRIPLEYCbCr **out, mc::block_info block, mc::vect v) {
    for (int i = 0; i < block.height; i++) {
        for (int j = 0; j < block.width; j++) {
            out[block.y + i][block.x + j].Y = clip(
                    128 + target[block.y + i][block.x + j].Y - base[block.y + v.y + i][block.x + v.x + j].Y,
                    0,
                    255);
        }
    }
}